

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O2

Index Eigen::internal::
      first_aligned_impl<16,_Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_false>
      ::run(Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *m)

{
  PointerType pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  pdVar1 = (m->super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
           m_data;
  uVar2 = (m->super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
          m_rows.m_value;
  if (((ulong)pdVar1 & 7) != 0) {
    return uVar2;
  }
  uVar3 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1);
  if ((long)uVar3 < (long)uVar2) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

EIGEN_DEVICE_FUNC
    inline const Scalar* data() const { return this->m_data; }